

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall vkt::memory::anon_unknown_0::CacheState::waitForIdle(CacheState *this)

{
  barrier(this,this->m_allowedStages,this->m_allowedAccesses & 0x15540,this->m_allowedStages,0);
  barrier(this,this->m_allowedStages,0,this->m_allowedStages & 0xffffbfff,this->m_allowedAccesses);
  return;
}

Assistant:

void CacheState::waitForIdle (void)
{
	// Make all writes available
	barrier(m_allowedStages,
			m_allowedAccesses & getWriteAccessFlags(),
			m_allowedStages,
			0);

	// Make all writes visible on device side
	barrier(m_allowedStages,
			0,
			m_allowedStages & (~vk::VK_PIPELINE_STAGE_HOST_BIT),
			m_allowedAccesses);
}